

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-mock-test.cc
# Opt level: O0

void __thiscall LocaleTest_LocaleMock_Test::TestBody(LocaleTest_LocaleMock_Test *this)

{
  LocaleType locale;
  ScopedMock<LocaleMock> mock;
  Matcher<__locale_struct_*> *in_stack_fffffffffffffd88;
  ScopedMock<LocaleMock> *in_stack_fffffffffffffd90;
  allocator *gmock_a1;
  LocaleMock *this_00;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  Matcher<int> *in_stack_fffffffffffffdc0;
  __locale_struct *in_stack_fffffffffffffdc8;
  Matcher<__locale_struct_*> *in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffdd8;
  pointer in_stack_fffffffffffffe80;
  pointer in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe94;
  pointer in_stack_fffffffffffffe98;
  MockSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *in_stack_fffffffffffffea0;
  
  ScopedMock<LocaleMock>::ScopedMock(in_stack_fffffffffffffd90);
  this_00 = (LocaleMock *)&stack0xfffffffffffffe60;
  testing::Matcher<int>::Matcher(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
  gmock_a1 = (allocator *)&stack0xfffffffffffffdc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffdc8,"foo",gmock_a1);
  testing::StrEq(in_stack_fffffffffffffdd8);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  testing::Matcher<__locale_struct_*>::Matcher(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  LocaleMock::gmock_newlocale
            (this_00,(Matcher<int> *)gmock_a1,(Matcher<const_char_*> *)in_stack_fffffffffffffd90,
             in_stack_fffffffffffffd88);
  testing::internal::MockSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::
  InternalExpectedAt(in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,
                     in_stack_fffffffffffffe94,(char *)in_stack_fffffffffffffe88,
                     (char *)in_stack_fffffffffffffe80);
  testing::Matcher<__locale_struct_*>::~Matcher((Matcher<__locale_struct_*> *)0x116d0f);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x116d1c);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x116d26);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdc7);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x116d47);
  newlocale(0xde,"foo",(__locale_t)0xb);
  ScopedMock<LocaleMock>::~ScopedMock((ScopedMock<LocaleMock> *)0x116d6d);
  return;
}

Assistant:

TEST(LocaleTest, LocaleMock) {
  ScopedMock<LocaleMock> mock;
  LocaleType locale = reinterpret_cast<LocaleType>(11);
  EXPECT_CALL(mock, newlocale(222, StrEq("foo"), locale));
  newlocale(222, "foo", locale);
}